

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSMultiValueFacet.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSMultiValueFacet::XSMultiValueFacet
          (XSMultiValueFacet *this,FACET facetKind,StringList *lexicalValues,bool isFixed,
          XSAnnotation *headAnnot,XSModel *xsModel,MemoryManager *manager)

{
  BaseRefVectorOf<xercesc_4_0::XSAnnotation> *this_00;
  XMLSize_t XVar1;
  int iVar2;
  XSAnnotationList *pXVar3;
  undefined4 extraout_var;
  
  XSObject::XSObject(&this->super_XSObject,MULTIVALUE_FACET,xsModel,manager);
  (this->super_XSObject)._vptr_XSObject = (_func_int **)&PTR__XSMultiValueFacet_00407a30;
  this->fFacetKind = facetKind;
  this->fIsFixed = isFixed;
  this->fLexicalValues = lexicalValues;
  this->fXSAnnotationList = (XSAnnotationList *)0x0;
  if (headAnnot != (XSAnnotation *)0x0) {
    pXVar3 = (XSAnnotationList *)XMemory::operator_new(0x30,manager);
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__BaseRefVectorOf_004072b0;
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fAdoptedElems = false;
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fCurCount = 0;
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fMaxCount = 1;
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList = (XSAnnotation **)0x0;
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fMemoryManager = manager;
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,8);
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>).fElemList =
         (XSAnnotation **)CONCAT44(extraout_var,iVar2);
    *(XSAnnotation **)CONCAT44(extraout_var,iVar2) = (XSAnnotation *)0x0;
    (pXVar3->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>)._vptr_BaseRefVectorOf =
         (_func_int **)&PTR__RefVectorOf_00407238;
    this->fXSAnnotationList = pXVar3;
    do {
      this_00 = &this->fXSAnnotationList->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>;
      BaseRefVectorOf<xercesc_4_0::XSAnnotation>::ensureExtraCapacity(this_00,1);
      XVar1 = this_00->fCurCount;
      this_00->fElemList[XVar1] = headAnnot;
      this_00->fCurCount = XVar1 + 1;
      headAnnot = XSAnnotation::getNext(headAnnot);
    } while (headAnnot != (XSAnnotation *)0x0);
  }
  return;
}

Assistant:

XSMultiValueFacet::XSMultiValueFacet(XSSimpleTypeDefinition::FACET facetKind,
                                     StringList*                   lexicalValues,
                                     bool                          isFixed,
                                     XSAnnotation* const           headAnnot,
                                     XSModel* const                xsModel,
                                     MemoryManager* const          manager)
    : XSObject(XSConstants::MULTIVALUE_FACET, xsModel, manager)
    , fFacetKind(facetKind)
    , fIsFixed(isFixed)
    , fLexicalValues(lexicalValues)
    , fXSAnnotationList(0)
{
    if (headAnnot)
    {        
        fXSAnnotationList = new (manager) RefVectorOf<XSAnnotation>(1, false, manager);
  
        XSAnnotation* annot = headAnnot;
        do 
        {
            fXSAnnotationList->addElement(annot);
            annot = annot->getNext();
        } while (annot);
    }
}